

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

void nghttp3_qpack_stream_pop_ref(nghttp3_qpack_stream *stream)

{
  undefined8 *puVar1;
  long in_RDI;
  nghttp3_qpack_header_block_ref *ref;
  nghttp3_pq_entry *in_stack_ffffffffffffffe8;
  nghttp3_ringbuf *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    __assert_fail("nghttp3_ringbuf_len(&stream->refs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                  ,0x6fa,"void nghttp3_qpack_stream_pop_ref(nghttp3_qpack_stream *)");
  }
  puVar1 = (undefined8 *)
           nghttp3_ringbuf_get(in_stack_fffffffffffffff0,(size_t)in_stack_ffffffffffffffe8);
  if (((nghttp3_pq *)*puVar1)->q != (nghttp3_pq_entry **)0xffffffffffffffff) {
    nghttp3_pq_remove((nghttp3_pq *)*puVar1,in_stack_ffffffffffffffe8);
    nghttp3_ringbuf_pop_front((nghttp3_ringbuf *)(in_RDI + 8));
    return;
  }
  __assert_fail("ref->max_cnts_pe.index != NGHTTP3_PQ_BAD_INDEX",
                "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                ,0x6ff,"void nghttp3_qpack_stream_pop_ref(nghttp3_qpack_stream *)");
}

Assistant:

void nghttp3_qpack_stream_pop_ref(nghttp3_qpack_stream *stream) {
  nghttp3_qpack_header_block_ref *ref;

  assert(nghttp3_ringbuf_len(&stream->refs));

  ref =
    *(nghttp3_qpack_header_block_ref **)nghttp3_ringbuf_get(&stream->refs, 0);

  assert(ref->max_cnts_pe.index != NGHTTP3_PQ_BAD_INDEX);

  nghttp3_pq_remove(&stream->max_cnts, &ref->max_cnts_pe);

  nghttp3_ringbuf_pop_front(&stream->refs);
}